

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest07KeyUsage_::
Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2
          (Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest07KeyUsage,
                     Section7InvalidkeyUsageNotCriticalkeyCertSignFalseTest2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "keyUsageNotCriticalkeyCertSignFalseCACert",
      "InvalidkeyUsageNotCriticalkeyCertSignFalseTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "keyUsageNotCriticalkeyCertSignFalseCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.7.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}